

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonSetFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  void *pvVar1;
  char *zFuncName;
  
  if (argc < 1) {
    return;
  }
  pvVar1 = ctx->pFunc->pUserData;
  if ((argc & 1U) == 0) {
    zFuncName = "set";
    if (((ulong)pvVar1 & 4) == 0) {
      zFuncName = "insert";
    }
    jsonWrongNumArgs(ctx,zFuncName);
    return;
  }
  jsonInsertIntoBlob(ctx,argc,argv,4 - (uint)(((ulong)pvVar1 & 4) == 0));
  return;
}

Assistant:

static void jsonSetFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){

  int flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  int bIsSet = (flags&JSON_ISSET)!=0;

  if( argc<1 ) return;
  if( (argc&1)==0 ) {
    jsonWrongNumArgs(ctx, bIsSet ? "set" : "insert");
    return;
  }
  jsonInsertIntoBlob(ctx, argc, argv, bIsSet ? JEDIT_SET : JEDIT_INS);
}